

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_file_mpi_create(BigFile *bf,char *basename,MPI_Comm comm)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  int rank;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (comm != (MPI_Comm)&ompi_mpi_comm_null) {
    MPI_Comm_rank(comm,&local_24);
    if (local_24 == 0) {
      iVar1 = big_file_create(bf,basename);
    }
    else {
      pcVar2 = _strdup(basename);
      bf->basename = pcVar2;
      iVar1 = 0;
    }
    iVar1 = big_file_mpi_broadcast_anyerror(iVar1,comm);
    return iVar1;
  }
  return 0;
}

Assistant:

int big_file_mpi_create(BigFile * bf, const char * basename, MPI_Comm comm) {
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);
    int rt;
    if (rank == 0) {
        rt = big_file_create(bf, basename);
    } else {
        /* FIXME : */
        bf->basename = _strdup(basename);
        rt = 0;
    }
    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}